

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.h
# Opt level: O0

StellaOutputProxy __thiscall
stella::detail::StellaOutput::operator<<(StellaOutput *this,char (*obj) [26])

{
  char (*in_RDX) [26];
  int local_24;
  int l;
  char (*obj_local) [26];
  StellaOutput *this_local;
  StellaOutputProxy *proxy;
  
  if (*(int *)(*obj + 0xc) < *(int *)(*obj + 8)) {
    StellaOutputProxy::StellaOutputProxy((StellaOutputProxy *)this);
  }
  else {
    for (local_24 = 1; local_24 < *(int *)(*obj + 8); local_24 = local_24 + 1) {
      std::operator<<(*(ostream **)*obj,"  ");
    }
    if (1 < *(int *)(*obj + 8)) {
      std::operator<<(*(ostream **)*obj," -- ");
    }
    StellaOutputProxy::StellaOutputProxy((StellaOutputProxy *)this);
    StellaOutputProxy::Init((StellaOutputProxy *)this,*(ostream **)*obj);
    StellaOutputProxy::operator<<((StellaOutputProxy *)this,in_RDX);
  }
  return (StellaOutputProxy)(ostream *)this;
}

Assistant:

StellaOutputProxy operator<<(const T& obj)
    {
        if (level_ > maxlevel_)
            return StellaOutputProxy();

        for (int l = 1; l < level_; ++l)
            (*pOut_) << "  ";

        if (level_ > 1) (*pOut_) << " -- ";

        StellaOutputProxy proxy;
        proxy.Init(*pOut_);
        proxy << obj;
        return proxy;
    }